

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

bool Assimp::IFC::IntersectingLineSegments
               (IfcVector2 *n0,IfcVector2 *n1,IfcVector2 *m0,IfcVector2 *m1,IfcVector2 *out0,
               IfcVector2 *out1)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar13 = n1->x;
  dVar7 = n1->y;
  dVar6 = n0->x;
  dVar1 = n0->y;
  dVar9 = dVar13 - dVar6;
  dVar10 = dVar7 - dVar1;
  dVar11 = m0->x - dVar6;
  dVar12 = m0->y - dVar1;
  dVar8 = m1->x;
  dVar2 = m1->y;
  dVar4 = dVar11 * dVar11 + dVar12 * dVar12;
  if (9.99999949475751e-11 <= dVar4) {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = dVar9 * dVar9 + dVar10 * dVar10;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    if (0.99999 < ABS(dVar11 * dVar9 + dVar10 * dVar12) / (dVar4 * dVar5)) goto LAB_005dd648;
LAB_005dd7ec:
    bVar3 = false;
  }
  else {
LAB_005dd648:
    dVar13 = dVar8 - dVar13;
    dVar7 = dVar2 - dVar7;
    dVar4 = dVar13 * dVar13 + dVar7 * dVar7;
    if (9.99999949475751e-11 <= dVar4) {
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar5 = dVar9 * dVar9 + dVar10 * dVar10;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      if (ABS(dVar13 * dVar9 + dVar7 * dVar10) / (dVar4 * dVar5) <= 0.99999) goto LAB_005dd7ec;
    }
    if (ABS(dVar9) <= ABS(dVar10)) {
      dVar8 = dVar2 - dVar1;
      dVar13 = dVar12 / dVar10;
      dVar7 = dVar8 / dVar10;
      if (ABS(dVar13) == INFINITY) {
        dVar13 = (double)(~-(ulong)(ABS(dVar12) < 9.999999717180685e-10) & (ulong)dVar13);
      }
    }
    else {
      dVar8 = dVar8 - dVar6;
      dVar13 = dVar11 / dVar9;
      dVar7 = dVar8 / dVar9;
      if (ABS(dVar13) == INFINITY) {
        dVar13 = (double)(~-(ulong)(ABS(dVar11) < 9.999999717180685e-10) & (ulong)dVar13);
      }
    }
    if ((ABS(dVar7) == INFINITY) && (ABS(dVar8) < 9.999999717180685e-10)) {
      dVar7 = 0.0;
    }
    dVar6 = dVar7;
    if (dVar13 <= dVar7) {
      dVar6 = dVar13;
      dVar13 = dVar7;
    }
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    if (dVar13 <= 0.0) {
      dVar13 = 0.0;
    }
    if (1.0 <= dVar6) {
      dVar6 = 1.0;
    }
    if (1.0 <= dVar13) {
      dVar13 = 1.0;
    }
    bVar3 = 9.999999747378752e-06 <= ABS(dVar13 - dVar6);
    if (9.999999747378752e-06 <= ABS(dVar13 - dVar6)) {
      dVar7 = n0->y;
      out0->x = dVar9 * dVar6 + n0->x;
      out0->y = dVar6 * dVar10 + dVar7;
      dVar7 = n0->y;
      out1->x = dVar9 * dVar13 + n0->x;
      out1->y = dVar10 * dVar13 + dVar7;
    }
  }
  return bVar3;
}

Assistant:

bool IntersectingLineSegments(const IfcVector2& n0, const IfcVector2& n1,
    const IfcVector2& m0, const IfcVector2& m1,
    IfcVector2& out0, IfcVector2& out1)
{
    const IfcVector2 n0_to_n1 = n1 - n0;

    const IfcVector2 n0_to_m0 = m0 - n0;
    const IfcVector2 n1_to_m1 = m1 - n1;

    const IfcVector2 n0_to_m1 = m1 - n0;

    const IfcFloat e = 1e-5f;
    const IfcFloat smalle = 1e-9f;

    static const IfcFloat inf = std::numeric_limits<IfcFloat>::infinity();

    if (!(n0_to_m0.SquareLength() < e*e || std::fabs(n0_to_m0 * n0_to_n1) / (n0_to_m0.Length() * n0_to_n1.Length()) > 1-1e-5 )) {
        return false;
    }

    if (!(n1_to_m1.SquareLength() < e*e || std::fabs(n1_to_m1 * n0_to_n1) / (n1_to_m1.Length() * n0_to_n1.Length()) > 1-1e-5 )) {
        return false;
    }

    IfcFloat s0;
    IfcFloat s1;

    // pick the axis with the higher absolute difference so the result
    // is more accurate. Since we cannot guarantee that the axis with
    // the higher absolute difference is big enough as to avoid
    // divisions by zero, the case 0/0 ~ infinity is detected and
    // handled separately.
    if(std::fabs(n0_to_n1.x) > std::fabs(n0_to_n1.y)) {
        s0 = n0_to_m0.x / n0_to_n1.x;
        s1 = n0_to_m1.x / n0_to_n1.x;

        if (std::fabs(s0) == inf && std::fabs(n0_to_m0.x) < smalle) {
            s0 = 0.;
        }
        if (std::fabs(s1) == inf && std::fabs(n0_to_m1.x) < smalle) {
            s1 = 0.;
        }
    }
    else {
        s0 = n0_to_m0.y / n0_to_n1.y;
        s1 = n0_to_m1.y / n0_to_n1.y;

        if (std::fabs(s0) == inf && std::fabs(n0_to_m0.y) < smalle) {
            s0 = 0.;
        }
        if (std::fabs(s1) == inf && std::fabs(n0_to_m1.y) < smalle) {
            s1 = 0.;
        }
    }

    if (s1 < s0) {
        std::swap(s1,s0);
    }

    s0 = std::max(0.0,s0);
    s1 = std::max(0.0,s1);

    s0 = std::min(1.0,s0);
    s1 = std::min(1.0,s1);

    if (std::fabs(s1-s0) < e) {
        return false;
    }

    out0 = n0 + s0 * n0_to_n1;
    out1 = n0 + s1 * n0_to_n1;

    return true;
}